

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildHeapBufferReload(IRBuilderAsmJs *this,uint32 offset,bool isFirstLoad)

{
  bool bVar1;
  bool bVar2;
  uint fieldOffset;
  int iVar3;
  JITTimeFunctionBody *pJVar4;
  AsmJsJITInfo *this_00;
  ShouldReload shouldReloadBufferPointer;
  bool isSharedMem;
  bool isWasm;
  anon_class_24_3_9b9f9fea AddLoadField;
  bool isFirstLoad_local;
  uint32 offset_local;
  IRBuilderAsmJs *this_local;
  
  _shouldReloadBufferPointer = (bool *)((long)&AddLoadField.offset + 3);
  AddLoadField.this = (IRBuilderAsmJs *)((long)&AddLoadField.offset + 4);
  AddLoadField.isFirstLoad = (bool *)this;
  AddLoadField.offset._3_1_ = isFirstLoad;
  AddLoadField.offset._4_4_ = offset;
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  bVar1 = JITTimeFunctionBody::IsWasmFunction(pJVar4);
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar4);
  bVar2 = AsmJsJITInfo::IsSharedMemory(this_00);
  if (bVar1) {
    fieldOffset = Js::WebAssemblyModule::GetMemoryOffset();
    BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
              ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,WasmMemoryReg,ModuleMemReg,
               fieldOffset,TyVar,DontReload);
    if (bVar2) {
      iVar3 = Js::WebAssemblyMemory::GetOffsetOfArrayBuffer();
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,ArrayReg,WasmMemoryReg,iVar3
                 ,TyVar,DontReload);
      iVar3 = Js::SharedArrayBuffer::GetSharedContentsOffset();
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,SharedContents,ArrayReg,
                 iVar3,TyVar,DontReload);
      iVar3 = Js::SharedContents::GetBufferOffset();
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,BufferReg,SharedContents,
                 iVar3,TyVar,DontReload);
      iVar3 = Js::SharedContents::GetBufferLengthOffset();
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,LengthReg,SharedContents,
                 iVar3,TyUint32,DoReload);
    }
    else {
      iVar3 = Js::WebAssemblyMemory::GetOffsetOfArrayBuffer();
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,ArrayReg,WasmMemoryReg,iVar3
                 ,TyVar,DoReload);
      pJVar4 = Func::GetJITFunctionBody(this->m_func);
      bVar1 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(pJVar4);
      iVar3 = Js::ArrayBuffer::GetBufferContentsOffset();
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,RefCountedBuffer,ArrayReg,
                 iVar3,TyVar,DoReload);
      iVar3 = Js::RefCountedBuffer::GetBufferOffset();
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,BufferReg,RefCountedBuffer,
                 iVar3,TyVar,(uint)bVar1);
      iVar3 = Js::ArrayBuffer::GetByteLengthOffset();
      BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
                ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,LengthReg,ArrayReg,iVar3,
                 TyUint32,DoReload);
    }
  }
  else {
    BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
              ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,ArrayReg,ModuleMemReg,0,TyVar,
               DontReload);
    iVar3 = Js::ArrayBuffer::GetBufferContentsOffset();
    BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
              ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,RefCountedBuffer,ArrayReg,
               iVar3,TyVar,DontReload);
    iVar3 = Js::RefCountedBuffer::GetBufferOffset();
    BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
              ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,BufferReg,RefCountedBuffer,
               iVar3,TyVar,DontReload);
    iVar3 = Js::ArrayBuffer::GetByteLengthOffset();
    BuildHeapBufferReload::anon_class_24_3_9b9f9fea::operator()
              ((anon_class_24_3_9b9f9fea *)&shouldReloadBufferPointer,LengthReg,ArrayReg,iVar3,
               TyUint32,DontReload);
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildHeapBufferReload(uint32 offset, bool isFirstLoad)
{
    enum ShouldReload
    {
        DoReload,
        DontReload
    };
    const auto AddLoadField = [&](AsmJsRegSlots::ConstSlots dst, AsmJsRegSlots::ConstSlots src, int32 fieldOffset, IRType type, ShouldReload shouldReload)
    {
        if (isFirstLoad || shouldReload == DoReload)
        {
            IR::RegOpnd * dstOpnd = BuildDstOpnd(dst, type);
            IR::Opnd * srcOpnd = IR::IndirOpnd::New(BuildSrcOpnd(src, type), fieldOffset, type, m_func);
            IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
            AddInstr(instr, offset);
        }
    };

#ifdef ENABLE_WASM
    const bool isWasm = m_func->GetJITFunctionBody()->IsWasmFunction();
    const bool isSharedMem = m_func->GetJITFunctionBody()->GetAsmJsInfo()->IsSharedMemory();

    if(isWasm)
    {
        // WebAssembly.Memory only needs to be loaded once as it can't change over the course of the function
        AddLoadField(AsmJsRegSlots::WasmMemoryReg, AsmJsRegSlots::ModuleMemReg, (int32)Js::WebAssemblyModule::GetMemoryOffset(), TyVar, DontReload);

        if (!isSharedMem)
        {
            // ArrayBuffer
            // GrowMemory can change the ArrayBuffer, we have to reload it
            AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::WasmMemoryReg, Js::WebAssemblyMemory::GetOffsetOfArrayBuffer(), TyVar, DoReload);

            // The buffer doesn't change when using Fast Virtual buffer even if we grow the memory
            ShouldReload shouldReloadBufferPointer = m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer() ? DontReload : DoReload;

            // ArrayBuffer.bufferContent
            AddLoadField(AsmJsRegSlots::RefCountedBuffer, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetBufferContentsOffset(), TyVar, DoReload);

            // RefCountedBuffer.buffer
            AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::RefCountedBuffer, Js::RefCountedBuffer::GetBufferOffset(), TyVar, shouldReloadBufferPointer);
            // ArrayBuffer.length
            AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetByteLengthOffset(), TyUint32, DoReload);
        }
        else
        {
            // SharedArrayBuffer
            // SharedArrayBuffer cannot be detached and the buffer cannot change, no need to reload
            AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::WasmMemoryReg, Js::WebAssemblyMemory::GetOffsetOfArrayBuffer(), TyVar, DontReload);
            // SharedArrayBuffer.SharedContents
            AddLoadField(AsmJsRegSlots::SharedContents, AsmJsRegSlots::ArrayReg, Js::SharedArrayBuffer::GetSharedContentsOffset(), TyVar, DontReload);
            // SharedContents.buffer
            AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::SharedContents, Js::SharedContents::GetBufferOffset(), TyVar, DontReload);
            // SharedContents.length
            AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::SharedContents, Js::SharedContents::GetBufferLengthOffset(), TyUint32, DoReload);
        }
    }
    else
#endif
    {
        // ArrayBuffer
        // The ArrayBuffer can be changed on the environment, if it is detached, we'll throw
        AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::ModuleMemReg, (int32)Js::AsmJsModuleMemory::MemoryTableBeginOffset, TyVar, DontReload);
        // ArrayBuffer.bufferContent
        AddLoadField(AsmJsRegSlots::RefCountedBuffer, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetBufferContentsOffset(), TyVar, DontReload);
        // RefCountedBuffer.buffer
        AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::RefCountedBuffer, Js::RefCountedBuffer::GetBufferOffset(), TyVar, DontReload);
        // ArrayBuffer.length
        AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetByteLengthOffset(), TyUint32, DontReload);
    }
}